

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsAdvDiff_FSA_non.c
# Opt level: O1

void PrintFinalStats(void *cvode_mem,int sensi,int err_con,int sensi_meth)

{
  uint uVar1;
  long netfS;
  long ncfnS;
  long nniS;
  long nsetupsS;
  long nfeS;
  long nfSe;
  long netf;
  long ncfn;
  long nni;
  long nsetups;
  long nfe;
  long nst;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  uVar1 = CVodeGetNumSteps(cvode_mem,&local_28);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumSteps",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumRhsEvals(cvode_mem,&local_30);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumRhsEvals",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumLinSolvSetups(cvode_mem,&local_38);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumLinSolvSetups",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumErrTestFails(cvode_mem,&local_50);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumErrTestFails",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumNonlinSolvIters(cvode_mem,&local_40);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
            "CVodeGetNumNonlinSolvIters",(ulong)uVar1);
  }
  uVar1 = CVodeGetNumNonlinSolvConvFails(cvode_mem,&local_48);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
            "CVodeGetNumNonlinSolvConvFails",(ulong)uVar1);
  }
  if (sensi != 0) {
    uVar1 = CVodeGetSensNumRhsEvals(cvode_mem,&local_58);
    if ((int)uVar1 < 0) {
      fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetSensNumRhsEvals"
              ,(ulong)uVar1);
    }
    uVar1 = CVodeGetNumRhsEvalsSens(cvode_mem,&local_60);
    if ((int)uVar1 < 0) {
      fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumRhsEvalsSens"
              ,(ulong)uVar1);
    }
    uVar1 = CVodeGetSensNumLinSolvSetups(cvode_mem,&local_68);
    if ((int)uVar1 < 0) {
      fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
              "CVodeGetSensNumLinSolvSetups",(ulong)uVar1);
    }
    if (err_con == 0) {
      local_80 = 0;
    }
    else {
      uVar1 = CVodeGetSensNumErrTestFails(cvode_mem,&local_80);
      if ((int)uVar1 < 0) {
        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                "CVodeGetSensNumErrTestFails",(ulong)uVar1);
      }
    }
    if ((sensi_meth & 0xfffffffeU) == 2) {
      uVar1 = CVodeGetSensNumNonlinSolvIters(cvode_mem,&local_70);
      if ((int)uVar1 < 0) {
        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                "CVodeGetSensNumNonlinSolvIters",(ulong)uVar1);
      }
      uVar1 = CVodeGetSensNumNonlinSolvConvFails(cvode_mem,&local_78);
      if ((int)uVar1 < 0) {
        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                "CVodeGetSensNumNonlinSolvConvFails",(ulong)uVar1);
      }
    }
    else {
      local_70 = 0;
      local_78 = 0;
    }
  }
  puts("\nFinal Statistics\n");
  printf("nst     = %5ld\n\n",local_28);
  printf("nfe     = %5ld\n",local_30);
  printf("netf    = %5ld    nsetups  = %5ld\n",local_50,local_38);
  printf("nni     = %5ld    ncfn     = %5ld\n",local_40,local_48);
  if (sensi != 0) {
    putchar(10);
    printf("nfSe    = %5ld    nfeS     = %5ld\n",local_58,local_60);
    printf("netfs   = %5ld    nsetupsS = %5ld\n",local_80,local_68);
    printf("nniS    = %5ld    ncfnS    = %5ld\n",local_70,local_78);
  }
  return;
}

Assistant:

static void PrintFinalStats(void* cvode_mem, sunbooleantype sensi,
                            sunbooleantype err_con, int sensi_meth)
{
  long int nst;
  long int nfe, nsetups, nni, ncfn, netf;
  long int nfSe, nfeS, nsetupsS, nniS, ncfnS, netfS;
  int retval;

  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  check_retval(&retval, "CVodeGetNumRhsEvals", 1);
  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  check_retval(&retval, "CVodeGetNumLinSolvSetups", 1);
  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  check_retval(&retval, "CVodeGetNumErrTestFails", 1);
  retval = CVodeGetNumNonlinSolvIters(cvode_mem, &nni);
  check_retval(&retval, "CVodeGetNumNonlinSolvIters", 1);
  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &ncfn);
  check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1);

  if (sensi)
  {
    retval = CVodeGetSensNumRhsEvals(cvode_mem, &nfSe);
    check_retval(&retval, "CVodeGetSensNumRhsEvals", 1);
    retval = CVodeGetNumRhsEvalsSens(cvode_mem, &nfeS);
    check_retval(&retval, "CVodeGetNumRhsEvalsSens", 1);
    retval = CVodeGetSensNumLinSolvSetups(cvode_mem, &nsetupsS);
    check_retval(&retval, "CVodeGetSensNumLinSolvSetups", 1);
    if (err_con)
    {
      retval = CVodeGetSensNumErrTestFails(cvode_mem, &netfS);
      check_retval(&retval, "CVodeGetSensNumErrTestFails", 1);
    }
    else { netfS = 0; }
    if ((sensi_meth == CV_STAGGERED) || (sensi_meth == CV_STAGGERED1))
    {
      retval = CVodeGetSensNumNonlinSolvIters(cvode_mem, &nniS);
      check_retval(&retval, "CVodeGetSensNumNonlinSolvIters", 1);
      retval = CVodeGetSensNumNonlinSolvConvFails(cvode_mem, &ncfnS);
      check_retval(&retval, "CVodeGetSensNumNonlinSolvConvFails", 1);
    }
    else
    {
      nniS  = 0;
      ncfnS = 0;
    }
  }

  printf("\nFinal Statistics\n\n");
  printf("nst     = %5ld\n\n", nst);
  printf("nfe     = %5ld\n", nfe);
  printf("netf    = %5ld    nsetups  = %5ld\n", netf, nsetups);
  printf("nni     = %5ld    ncfn     = %5ld\n", nni, ncfn);

  if (sensi)
  {
    printf("\n");
    printf("nfSe    = %5ld    nfeS     = %5ld\n", nfSe, nfeS);
    printf("netfs   = %5ld    nsetupsS = %5ld\n", netfS, nsetupsS);
    printf("nniS    = %5ld    ncfnS    = %5ld\n", nniS, ncfnS);
  }
}